

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh.cpp
# Opt level: O2

void __thiscall polyscope::VolumeMesh::prepare(VolumeMesh *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ShaderProgram *program;
  Engine *pEVar2;
  Engine *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_e3;
  allocator local_e2;
  allocator local_e1;
  string local_e0;
  __shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  pEVar2 = render::engine;
  std::__cxx11::string::string((string *)&local_e0,"MESH",&local_e1);
  this_00 = render::engine;
  pbVar1 = &(this->material).value;
  std::__cxx11::string::string((string *)&local_48,(string *)pbVar1);
  std::__cxx11::string::string
            ((string *)&local_68,"MESH_PROPAGATE_TYPE_AND_BASECOLOR2_SHADE",&local_e2);
  __l._M_len = 1;
  __l._M_array = &local_68;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b0,__l,&local_e3);
  addVolumeMeshRules(&local_98,this,&local_b0,true,false);
  render::Engine::addMaterialRules(&local_80,this_00,&local_48,&local_98);
  (*pEVar2->_vptr_Engine[0x2b])(&local_c0,pEVar2,&local_e0,&local_80,0);
  std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->program).
              super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
             &local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_e0);
  fillGeometryBuffers(this,(this->program).
                           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
  pEVar2 = render::engine;
  program = (this->program).
            super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&local_e0,(string *)pbVar1);
  render::Engine::setMaterial(pEVar2,program,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void VolumeMesh::prepare() {
  // clang-format off
  program = render::engine->requestShader("MESH", 
      render::engine->addMaterialRules(getMaterial(),
        addVolumeMeshRules(
          {"MESH_PROPAGATE_TYPE_AND_BASECOLOR2_SHADE"}
        )
      )
    );
  // clang-format on
  // Populate draw buffers
  fillGeometryBuffers(*program);
  render::engine->setMaterial(*program, getMaterial());
}